

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

idx_t duckdb::BitStringAggOperation::GetRange<duckdb::uhugeint_t>(uhugeint_t min,uhugeint_t max)

{
  bool bVar1;
  idx_t iVar2;
  uhugeint_t uVar3;
  uhugeint_t input;
  idx_t range;
  uhugeint_t result;
  idx_t local_40;
  uhugeint_t local_38;
  uhugeint_t local_28;
  uhugeint_t local_18;
  
  bVar1 = TrySubtractOperator::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                    (max,min,&local_38);
  iVar2 = 0xffffffffffffffff;
  if (bVar1) {
    uhugeint_t::uhugeint_t(&local_18,1);
    uVar3 = uhugeint_t::operator+(&local_38,&local_18);
    input.upper = (uint64_t)&local_40;
    input.lower = uVar3.upper;
    bVar1 = Uhugeint::TryCast<unsigned_long>((Uhugeint *)uVar3.lower,input,&local_40);
    if (bVar1) {
      local_28.lower._0_4_ = 0xffffffff;
      local_28.lower._4_4_ = 0xffffffff;
      local_28.upper._0_4_ = 0xffffffff;
      local_28.upper._4_4_ = 0xffffffff;
      bVar1 = uhugeint_t::operator==(&local_38,&local_28);
      iVar2 = 0xffffffffffffffff;
      if (!bVar1) {
        iVar2 = local_40;
      }
    }
    else {
      iVar2 = 0xffffffffffffffff;
    }
  }
  return iVar2;
}

Assistant:

idx_t BitStringAggOperation::GetRange(uhugeint_t min, uhugeint_t max) {
	uhugeint_t result;
	if (!TrySubtractOperator::Operation(max, min, result)) {
		return NumericLimits<idx_t>::Maximum();
	}
	idx_t range;
	if (!Uhugeint::TryCast(result + 1, range) || result == NumericLimits<uhugeint_t>::Maximum()) {
		return NumericLimits<idx_t>::Maximum();
	}
	return range;
}